

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

void __thiscall
embree::SceneGraphFlattener::convertFlattenedInstances
          (SceneGraphFlattener *this,
          vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
          *group,Ref<embree::SceneGraph::Node> *node)

{
  pointer pRVar1;
  bool bVar2;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *in_RDX;
  SceneGraphFlattener *in_RSI;
  Ref<embree::SceneGraph::Node> *child;
  iterator __end4;
  iterator __begin4;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *__range4;
  Ref<embree::SceneGraph::GroupNode> groupNode;
  Ref<embree::SceneGraph::TransformNode> xfmNode;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *in_stack_fffffffffffffeb8;
  __normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
  *in_stack_fffffffffffffec0;
  value_type *in_stack_fffffffffffffec8;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *in_stack_fffffffffffffed0;
  long *local_108;
  Ref<embree::SceneGraph::Node> *local_e8;
  __normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
  local_c0;
  long *local_b8;
  long *local_b0;
  
  pRVar1 = (in_RDX->
           super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pRVar1 == (pointer)0x0) {
    local_e8 = (Ref<embree::SceneGraph::Node> *)0x0;
  }
  else {
    local_e8 = (Ref<embree::SceneGraph::Node> *)
               __dynamic_cast(pRVar1,&SceneGraph::Node::typeinfo,
                              &SceneGraph::TransformNode::typeinfo,0);
  }
  if (local_e8 != (Ref<embree::SceneGraph::Node> *)0x0) {
    (**(code **)&local_e8->ptr->fileName)();
  }
  if (local_e8 == (Ref<embree::SceneGraph::Node> *)0x0) {
    pRVar1 = (in_RDX->
             super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (pRVar1 == (pointer)0x0) {
      local_108 = (long *)0x0;
    }
    else {
      local_108 = (long *)__dynamic_cast(pRVar1,&SceneGraph::Node::typeinfo,
                                         &SceneGraph::GroupNode::typeinfo,0);
    }
    local_b0 = local_108;
    if (local_108 != (long *)0x0) {
      (**(code **)(*local_108 + 0x10))();
    }
    if (local_b0 != (long *)0x0) {
      local_b8 = local_b0 + 0xd;
      local_c0._M_current =
           (Ref<embree::SceneGraph::Node> *)
           std::
           vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
           ::begin(in_stack_fffffffffffffeb8);
      std::
      vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
      ::end(in_stack_fffffffffffffeb8);
      while (bVar2 = __gnu_cxx::operator!=
                               (in_stack_fffffffffffffec0,
                                (__normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
                                 *)in_stack_fffffffffffffeb8), bVar2) {
        __gnu_cxx::
        __normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
        ::operator*(&local_c0);
        convertFlattenedInstances(in_RSI,in_RDX,local_e8);
        __gnu_cxx::
        __normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
        ::operator++(&local_c0);
      }
    }
    if (local_b0 != (long *)0x0) {
      (**(code **)(*local_b0 + 0x18))();
    }
  }
  else {
    std::
    vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
    ::push_back(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  }
  if (local_e8 != (Ref<embree::SceneGraph::Node> *)0x0) {
    (*(code *)(local_e8->ptr->fileName)._M_string_length)();
  }
  return;
}

Assistant:

void convertFlattenedInstances(std::vector<Ref<SceneGraph::Node>>& group, const Ref<SceneGraph::Node>& node)
    {
      if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
        group.push_back(node);
      } 
      else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) {
        for (const auto& child : groupNode->children) convertFlattenedInstances(group,child);
      }
    }